

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

int Dar2_LibBuildBest_rec(Gia_Man_t *p,Dar_LibObj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  Dar_LibDat_t *pDVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int Fill;
  int iVar9;
  
  pDVar1 = s_DarLib->pDatas;
  uVar8 = (ulong)*pObj >> 0x24;
  iVar7 = pDVar1[uVar8].field_0.iGunc;
  if (iVar7 < 0) {
    uVar5 = Dar2_LibBuildBest_rec
                      (p,(Dar_LibObj_t *)
                         (&s_DarLib->pObjs->field_0x0 + ((SUB84(*pObj,0) & 0xffff) << 3)));
    uVar6 = Dar2_LibBuildBest_rec(p,s_DarLib->pObjs + *(ushort *)&pObj->field_0x2);
    if (((int)uVar5 < 0) || ((int)uVar6 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf5,"int Abc_LitNotCond(int, int)");
    }
    pDVar1 = pDVar1 + uVar8;
    uVar5 = Gia_ManHashAnd(p,SUB84(*pObj,4) & 1 ^ uVar5,SUB84(*pObj,4) >> 1 & 1 ^ uVar6);
    (pDVar1->field_0).iGunc = uVar5;
    if ((int)uVar5 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf2,"int Abc_Lit2Var(int)");
    }
    if (p->nObjs <= (int)(uVar5 >> 1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar2 = p->pObjs;
    pObj_00 = pGVar2 + (uVar5 >> 1);
    uVar8 = *(ulong *)pObj_00 & 0x1fffffff;
    if (uVar8 != 0x1fffffff && -1 < (int)*(ulong *)pObj_00) {
      pGVar4 = pObj_00 + -uVar8;
      if ((pGVar4 < pGVar2) || (pGVar2 + (uint)p->nObjs <= pGVar4)) {
LAB_004b0541:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar5 = (int)((long)pGVar4 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar5 + 1,(int)pGVar2);
      if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
LAB_004b057f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar2 = pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff);
      pGVar4 = p->pObjs;
      if ((pGVar2 < pGVar4) || (pGVar4 + p->nObjs <= pGVar2)) goto LAB_004b0541;
      iVar7 = pVVar3->pArray[uVar5 & 0x7fffffff];
      uVar5 = (int)((long)pGVar2 - (long)pGVar4 >> 2) * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar5 + 1,Fill);
      if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) goto LAB_004b057f;
      pGVar2 = p->pObjs;
      if ((pObj_00 < pGVar2) || (pGVar2 + p->nObjs <= pObj_00)) goto LAB_004b0541;
      iVar9 = pVVar3->pArray[uVar5 & 0x7fffffff];
      uVar5 = (int)((long)pObj_00 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar3 = p->vLevels;
      Vec_IntFillExtra(pVVar3,uVar5 + 1,-0x55555555);
      if (((int)uVar5 < 0) || (pVVar3->nSize <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (iVar9 < iVar7) {
        iVar9 = iVar7;
      }
      pVVar3->pArray[uVar5 & 0x7fffffff] = iVar9 + 1;
    }
    Gia_ObjSetPhase(p,pObj_00);
    iVar7 = (pDVar1->field_0).iGunc;
  }
  return iVar7;
}

Assistant:

int Dar2_LibBuildBest_rec( Gia_Man_t * p, Dar_LibObj_t * pObj )
{
    Gia_Obj_t * pNode;
    Dar_LibDat_t * pData;
    int iFanin0, iFanin1;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->iGunc >= 0 )
        return pData->iGunc;
    iFanin0 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan0) );
    iFanin1 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan1) );
    iFanin0 = Abc_LitNotCond( iFanin0, pObj->fCompl0 );
    iFanin1 = Abc_LitNotCond( iFanin1, pObj->fCompl1 );
    pData->iGunc = Gia_ManHashAnd( p, iFanin0, iFanin1 );
    pNode = Gia_ManObj( p, Abc_Lit2Var(pData->iGunc) );
    if ( Gia_ObjIsAnd( pNode ) )
        Gia_ObjSetAndLevel( p, pNode );
    Gia_ObjSetPhase( p, pNode );
    return pData->iGunc;
}